

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
ObjectArrayInObject_SaveObjectArray2InObject_Test::
~ObjectArrayInObject_SaveObjectArray2InObject_Test
          (ObjectArrayInObject_SaveObjectArray2InObject_Test *this)

{
  ObjectArrayInObject_SaveObjectArray2InObject_Test *this_local;
  
  ~ObjectArrayInObject_SaveObjectArray2InObject_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectArrayInObject, SaveObjectArray2InObject) {
	stringstream ss;
	obj_array_var2 v;
	v.val1 = 1;
	v.val2 = 1.1f;
	v.val3.resize(2);
	v.val3[0].val1 = 1;
	v.val3[0].val2 = 1.1f;
	v.val3[1].val1 = 2;
	v.val3[1].val2 = 2.2f;
	EXPECT_TRUE(JSON_OK == save_object_to_stream(v, ss));
	EXPECT_TRUE(ss.str() == "{\n"
							"	\"val1\": 1,\n"
							"	\"val2\": 1.1,\n"
							"	\"val3\": [{\n"
							"			\"val1\": 1,\n"
							"			\"val2\": 1.1\n"
							"		},{\n"
							"			\"val1\": 2,\n"
							"			\"val2\": 2.2\n"
							"		}]\n"
							"}\n");
}